

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhighdpiscaling_p.h
# Opt level: O1

QRect QHighDpi::toNativePixels<QRect,QScreen>(QRect *value,QScreen *context)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  int iVar5;
  undefined8 uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  double extraout_XMM0_Qa;
  double dVar11;
  double dVar13;
  undefined1 auVar12 [16];
  double dVar14;
  double dVar16;
  undefined1 auVar15 [16];
  undefined1 auVar17 [16];
  QRect QVar18;
  
  uVar6 = QHighDpiScaling::scaleAndOrigin(context,(Point)ZEXT812(0));
  uVar1 = value->x1;
  uVar3 = value->y1;
  uVar2 = value->x2;
  uVar4 = value->y2;
  iVar8 = (int)((ulong)uVar6 >> 0x20);
  dVar14 = (double)(uVar3 - iVar8) * extraout_XMM0_Qa;
  dVar16 = (double)(uVar1 - (int)uVar6) * extraout_XMM0_Qa;
  dVar11 = extraout_XMM0_Qa * (double)((uVar4 - uVar3) + 1);
  dVar13 = extraout_XMM0_Qa * (double)((uVar2 - uVar1) + 1);
  auVar15._0_8_ = (double)((ulong)dVar14 & 0x8000000000000000 | 0x3fe0000000000000) + dVar14;
  auVar15._8_8_ = (double)((ulong)dVar16 & 0x8000000000000000 | 0x3fe0000000000000) + dVar16;
  auVar12._0_8_ = (double)((ulong)dVar11 & 0x8000000000000000 | 0x3fe0000000000000) + dVar11;
  auVar12._8_8_ = (double)((ulong)dVar13 & 0x8000000000000000 | 0x3fe0000000000000) + dVar13;
  auVar15 = minpd(_DAT_001369d0,auVar15);
  auVar12 = minpd(_DAT_001369d0,auVar12);
  auVar17._4_4_ = -(uint)(-2147483648.0 < auVar12._8_8_);
  auVar17._0_4_ = -(uint)(-2147483648.0 < auVar12._0_8_);
  auVar17._8_4_ = -(uint)(-2147483648.0 < auVar15._0_8_);
  auVar17._12_4_ = -(uint)(-2147483648.0 < auVar15._8_8_);
  uVar10 = movmskps((int)context,auVar17);
  iVar7 = (int)auVar15._8_8_;
  if ((uVar10 & 8) == 0) {
    iVar7 = -0x80000000;
  }
  iVar9 = (int)auVar15._0_8_;
  if ((uVar10 & 4) == 0) {
    iVar9 = -0x80000000;
  }
  iVar7 = iVar7 + (int)uVar6;
  iVar9 = iVar9 + iVar8;
  iVar8 = (int)auVar12._8_8_;
  if ((uVar10 & 2) == 0) {
    iVar8 = -0x80000000;
  }
  iVar5 = (int)auVar12._0_8_;
  if ((uVar10 & 1) == 0) {
    iVar5 = -0x80000000;
  }
  QVar18.x2.m_i = iVar8 + iVar7 + -1;
  QVar18.y1.m_i = iVar9;
  QVar18.x1.m_i = iVar7;
  QVar18.y2.m_i = iVar5 + iVar9 + -1;
  return QVar18;
}

Assistant:

T toNativePixels(const T &value, const C *context)
{
    QHighDpiScaling::ScaleAndOrigin so = QHighDpiScaling::scaleAndOrigin(context);
    return scale(value, so.factor, so.origin);
}